

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rbuVfsClose(sqlite3_file *pFile)

{
  _func_int_sqlite3_file_ptr_sqlite3_int64 **pp_Var1;
  sqlite3_mutex *psVar2;
  sqlite3_file *psVar3;
  _func_int_sqlite3_file_ptr_sqlite3_int64_ptr **pp_Var4;
  _func_int_sqlite3_file_ptr_int **pp_Var5;
  int iVar6;
  sqlite3rbu *pRbu;
  _func_int_sqlite3_file_ptr_int **pp_Var7;
  _func_int_sqlite3_file_ptr_sqlite3_int64_ptr **pp_Var8;
  long lVar9;
  
  if (0 < *(int *)((long)&pFile[6].pMethods + 4)) {
    lVar9 = 0;
    do {
      sqlite3_free(*(void **)(&(pFile[7].pMethods)->iVersion + lVar9 * 2));
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)((long)&pFile[6].pMethods + 4));
  }
  sqlite3_free(pFile[7].pMethods);
  pFile[7].pMethods = (sqlite3_io_methods *)0x0;
  sqlite3_free(pFile[8].pMethods);
  if ((*(uint *)&pFile[5].pMethods >> 8 & 1) == 0) {
    if (((*(uint *)&pFile[5].pMethods & 8) != 0) && (pFile[3].pMethods != (sqlite3_io_methods *)0x0)
       ) {
      pp_Var1 = &pFile[3].pMethods[2].xTruncate;
      *pp_Var1 = *pp_Var1 + -(long)pFile[4].pMethods;
      pFile[4].pMethods = (sqlite3_io_methods *)0x0;
    }
  }
  else {
    psVar2 = (sqlite3_mutex *)pFile[2].pMethods[1].xWrite;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
    }
    pp_Var5 = &pFile[2].pMethods[1].xSync;
    do {
      pp_Var7 = pp_Var5;
      psVar3 = (sqlite3_file *)*pp_Var7;
      if (psVar3 == (sqlite3_file *)0x0) break;
      pp_Var5 = (_func_int_sqlite3_file_ptr_int **)(psVar3 + 0xb);
    } while (psVar3 != pFile);
    if (psVar3 != (sqlite3_file *)0x0) {
      *pp_Var7 = (_func_int_sqlite3_file_ptr_int *)pFile[0xb].pMethods;
    }
    pFile[0xb].pMethods = (sqlite3_io_methods *)0x0;
    pp_Var4 = &pFile[2].pMethods[1].xFileSize;
    do {
      pp_Var8 = pp_Var4;
      psVar3 = (sqlite3_file *)*pp_Var8;
      if (psVar3 == (sqlite3_file *)0x0) break;
      pp_Var4 = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr **)(psVar3 + 0xc);
    } while (psVar3 != pFile);
    if (psVar3 != (sqlite3_file *)0x0) {
      *pp_Var8 = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)pFile[0xc].pMethods;
    }
    pFile[0xc].pMethods = (sqlite3_io_methods *)0x0;
    psVar2 = (sqlite3_mutex *)pFile[2].pMethods[1].xWrite;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar2);
    }
    rbuUnlockShm((rbu_file *)pFile);
    (**(code **)(*(long *)pFile[1].pMethods + 0x80))(pFile[1].pMethods,0);
  }
  iVar6 = (**(code **)(*(long *)pFile[1].pMethods + 8))();
  return iVar6;
}

Assistant:

static int rbuVfsClose(sqlite3_file *pFile){
  rbu_file *p = (rbu_file*)pFile;
  int rc;
  int i;

  /* Free the contents of the apShm[] array. And the array itself. */
  for(i=0; i<p->nShm; i++){
    sqlite3_free(p->apShm[i]);
  }
  sqlite3_free(p->apShm);
  p->apShm = 0;
  sqlite3_free(p->zDel);

  if( p->openFlags & SQLITE_OPEN_MAIN_DB ){
    rbuMainlistRemove(p);
    rbuUnlockShm(p);
    p->pReal->pMethods->xShmUnmap(p->pReal, 0);
  }
  else if( (p->openFlags & SQLITE_OPEN_DELETEONCLOSE) && p->pRbu ){
    rbuUpdateTempSize(p, 0);
  }
  assert( p->pMainNext==0 && p->pRbuVfs->pMain!=p );

  /* Close the underlying file handle */
  rc = p->pReal->pMethods->xClose(p->pReal);
  return rc;
}